

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void InitializeLogger(string *info_log_filename,string *warn_log_filename,string *erro_log_filename)

{
  byte bVar1;
  char cVar2;
  ostream *poVar3;
  
  std::ofstream::open(Logger::info_log_file_,(_Ios_Openmode)(info_log_filename->_M_dataplus)._M_p);
  std::ofstream::open(Logger::warn_log_file_,(_Ios_Openmode)(warn_log_filename->_M_dataplus)._M_p);
  std::ofstream::open(Logger::erro_log_file_,(_Ios_Openmode)(erro_log_filename->_M_dataplus)._M_p);
  bVar1 = std::__basic_file<char>::is_open();
  if (bVar1 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Cannot create file: ");
    poVar3 = std::operator<<(poVar3,(string *)info_log_filename);
    poVar3 = std::operator<<(poVar3,". ");
    poVar3 = std::operator<<(poVar3,"Please check that whether you need to ");
    std::operator<<(poVar3,"create a new directory. \n");
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Cannot create file: ");
    poVar3 = std::operator<<(poVar3,(string *)warn_log_filename);
    poVar3 = std::operator<<(poVar3,". ");
    poVar3 = std::operator<<(poVar3,"Please check that whether you need to ");
    std::operator<<(poVar3,"create a new directory. \n");
    bVar1 = 1;
  }
  else {
    bVar1 = bVar1 ^ 1;
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Cannot create file:  ");
    poVar3 = std::operator<<(poVar3,(string *)erro_log_filename);
    poVar3 = std::operator<<(poVar3,". ");
    poVar3 = std::operator<<(poVar3,"Please check that whether you need to ");
    std::operator<<(poVar3,"create a new directory. \n");
  }
  else if (bVar1 == 0) {
    return;
  }
  exit(0);
}

Assistant:

void InitializeLogger(const std::string& info_log_filename,
                      const std::string& warn_log_filename,
                      const std::string& erro_log_filename) {
  Logger::info_log_file_.open(info_log_filename.c_str());
  Logger::warn_log_file_.open(warn_log_filename.c_str());
  Logger::erro_log_file_.open(erro_log_filename.c_str());
  // check if the file has been open
  bool bo = false;
  if (Logger::info_log_file_.is_open() == 0) {
    std::cout << "Cannot create file: " << info_log_filename << ". "
              << "Please check that whether you need to "
              << "create a new directory. \n";
    bo = true;
  }
  if (Logger::warn_log_file_.is_open() == 0) {
    std::cout << "Cannot create file: " << warn_log_filename << ". "
              << "Please check that whether you need to "
              << "create a new directory. \n";
    bo = true;
  }
  if (Logger::erro_log_file_.is_open() == 0) {
    std::cout << "Cannot create file:  " << erro_log_filename << ". "
              << "Please check that whether you need to "
              << "create a new directory. \n";
    bo = true;
  }
  if (bo) { exit(0); }
}